

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.h
# Opt level: O3

void __thiscall
BronKerbosch::BronKerbosch
          (BronKerbosch *this,EdgeCalculator *edge_calculator,CliqueCollector *clique_collector,
          LogWriter *lw)

{
  (this->super_CliqueFinder).edge_calculator = edge_calculator;
  (this->super_CliqueFinder).clique_collector = clique_collector;
  (this->super_CliqueFinder).initialized = false;
  (this->super_CliqueFinder).converged = false;
  (this->super_CliqueFinder).alignment_count = 0;
  (this->super_CliqueFinder).second_edge_calculator = (EdgeCalculator *)0x0;
  (this->super_CliqueFinder).next_id = 0;
  (this->super_CliqueFinder)._vptr_CliqueFinder = (_func_int **)&PTR__BronKerbosch_001b7d68;
  (this->alignments_).super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alignments_).super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alignments_).super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->lw = lw;
  this->order_ = (list<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  this->vertices_ =
       (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)0x0;
  this->degree_map_ = (degree_map_t *)0x0;
  this->actives_ =
       (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        *)0x0;
  this->vertices_as_lists_ =
       (vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        *)0x0;
  return;
}

Assistant:

CliqueFinder(const EdgeCalculator& edge_calculator, CliqueCollector& clique_collector) : edge_calculator(edge_calculator), clique_collector(clique_collector) {
    	alignment_count = 0;
    	second_edge_calculator = nullptr;
        next_id = 0;
        initialized = false;
        converged = false;        
    }